

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall cmStateDirectory::ComputeRelativePathTopBinary(cmStateDirectory *this)

{
  pointer pcVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  PointerType pBVar5;
  cmStateSnapshot *this_00;
  string result;
  cmStateSnapshot snapshot;
  string currentBinary;
  cmStateSnapshot *local_d8;
  iterator iStack_d0;
  cmStateSnapshot *local_c8;
  cmStateDirectory *local_c0;
  string local_b8;
  cmStateSnapshot local_98;
  undefined1 local_78 [40];
  string local_50;
  
  local_98.Position.Position = (this->Snapshot_).Position.Position;
  local_98.State = (this->Snapshot_).State;
  local_98.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8 = (cmStateSnapshot *)0x0;
  iStack_d0._M_current = (cmStateSnapshot *)0x0;
  local_c8 = (cmStateSnapshot *)0x0;
  std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
  _M_realloc_insert<cmStateSnapshot_const&>
            ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,(iterator)0x0,
             &local_98);
  do {
    while( true ) {
      cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_78,&local_98);
      local_98.Position.Position = local_78._16_8_;
      local_98.State = (cmState *)local_78._0_8_;
      local_98.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_78._8_8_;
      bVar3 = cmStateSnapshot::IsValid(&local_98);
      if (!bVar3) {
        local_c0 = this;
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,local_d8);
        pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_78);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar1 = (pBVar5->OutputLocation)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar1,pcVar1 + (pBVar5->OutputLocation)._M_string_length);
        iVar2._M_current = iStack_d0._M_current;
        this_00 = local_d8 + 1;
        if (this_00 != iStack_d0._M_current) {
          do {
            cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,this_00);
            pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->((iterator *)local_78);
            pcVar1 = (pBVar5->OutputLocation)._M_dataplus._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + (pBVar5->OutputLocation)._M_string_length
                      );
            bVar3 = cmsys::SystemTools::IsSubDirectory(&local_b8,&local_50);
            if (bVar3) {
              std::__cxx11::string::_M_assign((string *)&local_b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            this_00 = this_00 + 1;
          } while (this_00 != iVar2._M_current);
        }
        bVar3 = true;
        if (1 < local_b8._M_string_length) {
          std::__cxx11::string::substr((ulong)local_78,(ulong)&local_b8);
          iVar4 = std::__cxx11::string::compare(local_78);
          bVar3 = iVar4 != 0;
          if ((cmState *)local_78._0_8_ != (cmState *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                       *)local_78._16_8_)->_M_t)._M_impl.field_0x1);
          }
        }
        if (bVar3) {
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          std::__cxx11::string::_M_assign((string *)&pBVar5->RelativePathTopBinary);
        }
        else {
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          (pBVar5->RelativePathTopBinary)._M_string_length = 0;
          *(pBVar5->RelativePathTopBinary)._M_dataplus._M_p = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (cmStateSnapshot *)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        return;
      }
      if (iStack_d0._M_current != local_c8) break;
      std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
      _M_realloc_insert<cmStateSnapshot_const&>
                ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,iStack_d0,
                 &local_98);
    }
    ((iStack_d0._M_current)->Position).Position = local_98.Position.Position;
    *(undefined4 *)&(iStack_d0._M_current)->State = local_98.State._0_4_;
    *(undefined4 *)((long)&(iStack_d0._M_current)->State + 4) = local_98.State._4_4_;
    *(undefined4 *)&((iStack_d0._M_current)->Position).Tree = local_98.Position.Tree._0_4_;
    *(undefined4 *)((long)&((iStack_d0._M_current)->Position).Tree + 4) =
         local_98.Position.Tree._4_4_;
    iStack_d0._M_current = iStack_d0._M_current + 1;
  } while( true );
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopBinary()
{
  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentBinary();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentBinary = snp.GetDirectory().GetCurrentBinary();
    if (cmSystemTools::IsSubDirectory(result, currentBinary)) {
      result = currentBinary;
    }
  }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if (result.size() < 2 || result.substr(0, 2) != "//") {
    this->DirectoryState->RelativePathTopBinary = result;
  } else {
    this->DirectoryState->RelativePathTopBinary.clear();
  }
}